

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classic_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Classic_Emu::set_sample_rate_(Classic_Emu *this,long rate)

{
  int iVar1;
  Stereo_Buffer *this_00;
  undefined4 extraout_var;
  
  if (this->buf == (Multi_Buffer *)0x0) {
    if (this->stereo_buffer == (Multi_Buffer *)0x0) {
      this_00 = (Stereo_Buffer *)malloc(0x100);
      if (this_00 == (Stereo_Buffer *)0x0) {
        this_00 = (Stereo_Buffer *)0x0;
      }
      else {
        Stereo_Buffer::Stereo_Buffer(this_00);
      }
      this->stereo_buffer = &this_00->super_Multi_Buffer;
      if (this_00 == (Stereo_Buffer *)0x0) {
        return "Out of memory";
      }
    }
    this->buf = this->stereo_buffer;
  }
  iVar1 = (*this->buf->_vptr_Multi_Buffer[4])(this->buf,rate,0x32);
  return (blargg_err_t)CONCAT44(extraout_var,iVar1);
}

Assistant:

blargg_err_t Classic_Emu::set_sample_rate_( long rate )
{
	if ( !buf )
	{
		if ( !stereo_buffer )
			CHECK_ALLOC( stereo_buffer = BLARGG_NEW Stereo_Buffer );
		buf = stereo_buffer;
	}
	return buf->set_sample_rate( rate, 1000 / 20 );
}